

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  AccelData *pAVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  RayK<4> *pRVar21;
  RayK<4> *pRVar22;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  byte bVar27;
  ulong uVar28;
  ulong uVar29;
  RayK<4> *pRVar30;
  byte bVar31;
  ulong uVar32;
  bool bVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vint4 ai;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  vint4 ai_3;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  vint4 bi;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  int in_XMM4_Da;
  int in_XMM4_Db;
  int in_XMM4_Dc;
  int in_XMM4_Dd;
  float fVar91;
  float fVar96;
  float fVar97;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  vint4 bi_3;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  vint4 ai_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  vint4 bi_2;
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined4 uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  vint<4> octant;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  uint local_267c;
  uint local_2678;
  float local_2508;
  float fStack_2504;
  float fStack_2500;
  float fStack_24fc;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  uint local_2408 [4];
  undefined1 local_23f8 [16];
  undefined1 local_23e8 [16];
  undefined1 local_23d8 [16];
  undefined1 local_23c8 [16];
  undefined1 local_23b8 [16];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [32];
  ulong local_2378 [2];
  RayK<4> local_2368 [9016];
  
  ai.field_0 = in_ZMM0._0_16_;
  auVar113 = vpcmpeqd_avx((undefined1  [16])ai.field_0,(undefined1  [16])ai.field_0);
  uVar35 = vpcmpeqd_avx512vl(auVar113,(undefined1  [16])valid_i->field_0);
  uVar35 = uVar35 & 0xf;
  bVar17 = (byte)uVar35;
  if (bVar17 == 0) {
    return;
  }
  pAVar2 = This->ptr;
  local_23b8 = *(undefined1 (*) [16])ray;
  auVar103 = ZEXT1664(local_23b8);
  local_23c8 = *(undefined1 (*) [16])(ray + 0x10);
  auVar107 = ZEXT1664(local_23c8);
  local_23d8 = *(undefined1 (*) [16])(ray + 0x20);
  auVar109 = ZEXT1664(local_23d8);
  auVar42 = *(undefined1 (*) [16])(ray + 0x40);
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx(auVar51,auVar42);
  auVar55._8_4_ = 0x219392ef;
  auVar55._0_8_ = 0x219392ef219392ef;
  auVar55._12_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar37,auVar55,1);
  auVar37 = vblendmps_avx512vl(auVar42,auVar55);
  bVar33 = (bool)((byte)uVar36 & 1);
  auVar40._0_4_ = (uint)bVar33 * auVar37._0_4_ | (uint)!bVar33 * in_XMM4_Da;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar33 * auVar37._4_4_ | (uint)!bVar33 * in_XMM4_Db;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar33 * auVar37._8_4_ | (uint)!bVar33 * in_XMM4_Dc;
  bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar33 * auVar37._12_4_ | (uint)!bVar33 * in_XMM4_Dd;
  auVar37 = *(undefined1 (*) [16])(ray + 0x50);
  auVar39 = vandps_avx(auVar51,auVar37);
  uVar36 = vcmpps_avx512vl(auVar39,auVar55,1);
  bVar33 = (bool)((byte)uVar36 & 1);
  auVar43._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._8_4_;
  bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._12_4_;
  auVar37 = *(undefined1 (*) [16])(ray + 0x60);
  auVar39 = vandps_avx(auVar51,auVar37);
  uVar36 = vcmpps_avx512vl(auVar39,auVar55,1);
  bVar33 = (bool)((byte)uVar36 & 1);
  auVar38._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._8_4_;
  bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._12_4_;
  auVar39 = vrcp14ps_avx512vl(auVar40);
  auVar49 = ZEXT816(0);
  auVar112 = ZEXT1664(auVar49);
  auVar50._8_4_ = 0x3f800000;
  auVar50._0_8_ = &DAT_3f8000003f800000;
  auVar50._12_4_ = 0x3f800000;
  auVar95 = ZEXT1664(auVar50);
  auVar37 = vfnmadd213ps_fma(auVar40,auVar39,auVar50);
  auVar37 = vfmadd132ps_fma(auVar37,auVar39,auVar39);
  auVar40 = vrcp14ps_avx512vl(auVar43);
  auVar39 = vfnmadd213ps_fma(auVar43,auVar40,auVar50);
  auVar39 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar41 = vrcp14ps_avx512vl(auVar38);
  auVar40 = vfnmadd213ps_fma(auVar38,auVar41,auVar50);
  auVar40 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
  local_23e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar49);
  local_23f8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar49);
  auVar42 = vcmpps_avx(auVar42,auVar49,1);
  auVar41._8_4_ = 1;
  auVar41._0_8_ = 0x100000001;
  auVar41._12_4_ = 1;
  auVar41 = vandps_avx512vl(auVar42,auVar41);
  uVar36 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [16])(ray + 0x50),0xe);
  local_267c = (uint)uVar35 ^ 0xf;
  auVar52._8_4_ = 2;
  auVar52._0_8_ = 0x200000002;
  auVar52._12_4_ = 2;
  auVar90 = ZEXT1664(auVar52);
  auVar42 = vpsubd_avx512vl(auVar52,auVar42);
  bVar33 = (bool)((byte)uVar36 & 1);
  auVar48._0_4_ = (uint)bVar33 * auVar42._0_4_ | (uint)!bVar33 * auVar41._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * auVar41._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * auVar41._8_4_;
  bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * auVar41._12_4_;
  uVar36 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [16])(ray + 0x60),0xe);
  auVar42._8_4_ = 4;
  auVar42._0_8_ = 0x400000004;
  auVar42._12_4_ = 4;
  auVar42 = vpord_avx512vl(auVar48,auVar42);
  bVar33 = (bool)((byte)uVar36 & 1);
  auVar49._0_4_ = (uint)bVar33 * auVar42._0_4_ | !bVar33 * auVar48._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar33 * auVar42._4_4_ | !bVar33 * auVar48._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar33 * auVar42._8_4_ | !bVar33 * auVar48._8_4_;
  bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar33 * auVar42._12_4_ | !bVar33 * auVar48._12_4_;
  auVar84 = ZEXT1664(auVar49);
  auVar42 = vmovdqa32_avx512vl(auVar49);
  local_2408[0] = (uint)(bVar17 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar17 & 1) * auVar113._0_4_;
  bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
  local_2408[1] = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * auVar113._4_4_;
  bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
  local_2408[2] = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * auVar113._8_4_;
  bVar33 = SUB81(uVar35 >> 3,0);
  local_2408[3] = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * auVar113._12_4_;
  auVar79 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  auVar113._0_4_ = auVar37._0_4_ * -local_23b8._0_4_;
  auVar113._4_4_ = auVar37._4_4_ * -local_23b8._4_4_;
  auVar113._8_4_ = auVar37._8_4_ * -local_23b8._8_4_;
  auVar113._12_4_ = auVar37._12_4_ * -local_23b8._12_4_;
  auVar114._0_4_ = auVar39._0_4_ * -local_23c8._0_4_;
  auVar114._4_4_ = auVar39._4_4_ * -local_23c8._4_4_;
  auVar114._8_4_ = auVar39._8_4_ * -local_23c8._8_4_;
  auVar114._12_4_ = auVar39._12_4_ * -local_23c8._12_4_;
  auVar115._0_4_ = auVar40._0_4_ * -local_23d8._0_4_;
  auVar115._4_4_ = auVar40._4_4_ * -local_23d8._4_4_;
  auVar115._8_4_ = auVar40._8_4_ * -local_23d8._8_4_;
  auVar115._12_4_ = auVar40._12_4_ * -local_23d8._12_4_;
  pRVar21 = ray;
LAB_0084a746:
  lVar23 = 0;
  for (uVar36 = uVar35; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar1 = local_2408[lVar23];
  auVar72._4_4_ = uVar1;
  auVar72._0_4_ = uVar1;
  auVar72._8_4_ = uVar1;
  auVar72._12_4_ = uVar1;
  auVar53._4_4_ = local_2408[1];
  auVar53._0_4_ = local_2408[0];
  auVar53._8_4_ = local_2408[2];
  auVar53._12_4_ = local_2408[3];
  uVar36 = vpcmpeqd_avx512vl(auVar72,auVar53);
  uVar36 = uVar36 & 0xf;
  bVar27 = (byte)uVar36;
  local_2378[1] = CONCAT44((int)((ulong)pRVar21 >> 0x20),(uint)bVar27);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar41 = vblendmps_avx512vl(auVar42,auVar37);
  auVar56._0_4_ = (uint)(bVar27 & 1) * auVar41._0_4_ | !(bool)(bVar27 & 1) * uVar1;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar33 * auVar41._4_4_ | !bVar33 * uVar1;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar33 * auVar41._8_4_ | !bVar33 * uVar1;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar56._12_4_ = (uint)bVar33 * auVar41._12_4_ | !bVar33 * uVar1;
  auVar41 = vblendmps_avx512vl(auVar42,auVar39);
  auVar57._0_4_ = (uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar79._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar33 * auVar41._4_4_ | (uint)!bVar33 * auVar79._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar33 * auVar41._8_4_ | (uint)!bVar33 * auVar79._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar57._12_4_ = (uint)bVar33 * auVar41._12_4_ | (uint)!bVar33 * auVar79._12_4_;
  auVar41 = vblendmps_avx512vl(auVar42,auVar40);
  auVar58._0_4_ = (uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar84._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar33 * auVar41._4_4_ | (uint)!bVar33 * auVar84._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar33 * auVar41._8_4_ | (uint)!bVar33 * auVar84._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar58._12_4_ = (uint)bVar33 * auVar41._12_4_ | (uint)!bVar33 * auVar84._12_4_;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar43 = vblendmps_avx512vl(auVar41,auVar37);
  auVar59._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar90._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar90._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * auVar90._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar59._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * auVar90._12_4_;
  auVar43 = vblendmps_avx512vl(auVar41,auVar39);
  auVar60._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar95._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar95._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * auVar95._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar60._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * auVar95._12_4_;
  auVar43 = vblendmps_avx512vl(auVar41,auVar40);
  auVar61._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar103._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar103._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * auVar103._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar61._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * auVar103._12_4_;
  auVar43 = vblendmps_avx512vl(auVar42,local_23b8);
  auVar62._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar107._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar107._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * auVar107._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar62._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * auVar107._12_4_;
  auVar43 = vblendmps_avx512vl(auVar42,local_23c8);
  auVar63._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar109._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar109._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * auVar109._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar63._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * auVar109._12_4_;
  auVar43 = vblendmps_avx512vl(auVar42,local_23d8);
  auVar64._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar112._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar112._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * auVar112._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar64._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * auVar112._12_4_;
  auVar43 = vblendmps_avx512vl(auVar41,local_23b8);
  auVar65._0_4_ =
       (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * (int)local_23b8._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * (int)local_23b8._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * (int)local_23b8._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar65._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * (int)local_23b8._12_4_;
  auVar43 = vblendmps_avx512vl(auVar41,local_23c8);
  auVar66._0_4_ =
       (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * (int)local_23c8._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * (int)local_23c8._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * (int)local_23c8._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar66._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * (int)local_23c8._12_4_;
  auVar43 = vblendmps_avx512vl(auVar41,local_23d8);
  auVar67._0_4_ =
       (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * (int)local_23d8._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * (int)local_23d8._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * (int)local_23d8._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar67._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * (int)local_23d8._12_4_;
  auVar43 = vblendmps_avx512vl(auVar41,local_23f8);
  auVar44._0_4_ = (uint)(bVar27 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar27 & 1) * in_ZMM21._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * in_ZMM21._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar33 * auVar43._8_4_ | (uint)!bVar33 * in_ZMM21._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar44._12_4_ = (uint)bVar33 * auVar43._12_4_ | (uint)!bVar33 * in_ZMM21._12_4_;
  in_ZMM21 = ZEXT1664(auVar44);
  auVar42 = vblendmps_avx512vl(auVar42,local_23e8);
  auVar45._0_4_ = (uint)(bVar27 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar41._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * auVar41._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * auVar41._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar45._12_4_ = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * auVar41._12_4_;
  auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  auVar42 = vpblendmd_avx512vl(auVar42,local_23e8);
  auVar46._0_4_ = (uint)(bVar27 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar27 & 1) * in_ZMM22._0_4_;
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * in_ZMM22._4_4_;
  bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * in_ZMM22._8_4_;
  bVar33 = SUB81(uVar36 >> 3,0);
  auVar46._12_4_ = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * in_ZMM22._12_4_;
  in_ZMM22 = ZEXT1664(auVar46);
  local_2678 = (uint)uVar36;
  uVar35 = ~local_2378[1] & uVar35;
  auVar42 = vshufps_avx512vl(auVar56,auVar56,0xb1);
  auVar42 = vminps_avx512vl(auVar42,auVar56);
  auVar41 = vshufpd_avx512vl(auVar42,auVar42,1);
  auVar42 = vminps_avx512vl(auVar41,auVar42);
  auVar41 = vshufps_avx512vl(auVar57,auVar57,0xb1);
  auVar41 = vminps_avx512vl(auVar41,auVar57);
  auVar43 = vshufpd_avx512vl(auVar41,auVar41,1);
  auVar41 = vminps_avx512vl(auVar43,auVar41);
  auVar42 = vinsertps_avx(auVar42,auVar41,0x1c);
  auVar41 = vshufps_avx(auVar58,auVar58,0xb1);
  auVar41 = vminps_avx(auVar41,auVar58);
  auVar43 = vshufpd_avx(auVar41,auVar41,1);
  auVar41 = vminps_avx(auVar43,auVar41);
  auVar42 = vinsertps_avx(auVar42,auVar41,0x20);
  auVar41 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar41 = vmaxps_avx(auVar41,auVar59);
  auVar43 = vshufpd_avx(auVar41,auVar41,1);
  auVar41 = vmaxps_avx(auVar43,auVar41);
  auVar43 = vshufps_avx(auVar60,auVar60,0xb1);
  auVar43 = vmaxps_avx(auVar43,auVar60);
  auVar38 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vmaxps_avx(auVar38,auVar43);
  auVar41 = vinsertps_avx(auVar41,auVar43,0x1c);
  auVar43 = vshufps_avx(auVar61,auVar61,0xb1);
  auVar43 = vmaxps_avx(auVar43,auVar61);
  auVar38 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vmaxps_avx(auVar38,auVar43);
  auVar41 = vinsertps_avx(auVar41,auVar43,0x20);
  uVar36 = vcmpps_avx512vl(auVar42,ZEXT816(0) << 0x20,5);
  auVar43 = vblendmps_avx512vl(auVar41,auVar42);
  bVar27 = (byte)uVar36;
  fVar98 = (float)((uint)(bVar27 & 1) * auVar43._0_4_);
  fVar91 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar43._4_4_);
  auVar47._4_4_ = fVar91;
  auVar47._0_4_ = fVar98;
  fVar96 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar43._8_4_);
  auVar47._8_4_ = fVar96;
  fVar97 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar43._12_4_);
  auVar47._12_4_ = fVar97;
  auVar55 = vmovshdup_avx(auVar47);
  uVar32 = (ulong)(auVar55._0_4_ < 0.0) << 5 | 0x40;
  auVar43 = vshufpd_avx(auVar47,auVar47,1);
  uVar18 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
  auVar43 = vshufps_avx(auVar62,auVar62,0xb1);
  auVar43 = vminps_avx(auVar43,auVar62);
  auVar38 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vminps_avx(auVar38,auVar43);
  auVar38 = vshufps_avx(auVar63,auVar63,0xb1);
  auVar38 = vminps_avx(auVar38,auVar63);
  auVar48 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vminps_avx(auVar48,auVar38);
  auVar43 = vinsertps_avx(auVar43,auVar38,0x1c);
  auVar38 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar38 = vminps_avx(auVar38,auVar64);
  auVar48 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vminps_avx(auVar48,auVar38);
  auVar43 = vinsertps_avx(auVar43,auVar38,0x20);
  auVar38 = vshufps_avx(auVar65,auVar65,0xb1);
  auVar38 = vmaxps_avx(auVar38,auVar65);
  auVar48 = vshufpd_avx(auVar38,auVar38,1);
  auVar38 = vmaxps_avx(auVar48,auVar38);
  auVar48 = vshufps_avx512vl(auVar66,auVar66,0xb1);
  auVar49 = vmaxps_avx512vl(auVar48,auVar66);
  auVar48 = vshufpd_avx(auVar49,auVar49,1);
  auVar48 = vmaxps_avx(auVar48,auVar49);
  auVar38 = vinsertps_avx(auVar38,auVar48,0x1c);
  auVar48 = vshufps_avx512vl(auVar67,auVar67,0xb1);
  auVar49 = vmaxps_avx512vl(auVar48,auVar67);
  auVar48 = vshufpd_avx(auVar49,auVar49,1);
  auVar48 = vmaxps_avx(auVar48,auVar49);
  auVar38 = vinsertps_avx(auVar38,auVar48,0x20);
  auVar50 = vblendmps_avx512vl(auVar38,auVar43);
  bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
  bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
  bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
  bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
  bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
  bVar8 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar49 = vshufps_avx512vl(auVar44,auVar44,0xb1);
  auVar51 = vmaxps_avx512vl(auVar49,auVar44);
  auVar49 = vshufpd_avx(auVar51,auVar51,1);
  auVar52 = vshufps_avx512vl(auVar45,auVar45,0xb1);
  auVar53 = vminps_avx512vl(auVar52,auVar45);
  auVar52 = vshufpd_avx(auVar53,auVar53,1);
  auVar52 = vminps_avx(auVar52,auVar53);
  auVar49 = vmaxps_avx(auVar49,auVar51);
  auVar103 = ZEXT1664(auVar49);
  auVar54._0_4_ =
       (float)((uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar42._0_4_);
  bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar54._4_4_ = (float)((uint)bVar4 * auVar41._4_4_ | (uint)!bVar4 * auVar42._4_4_);
  bVar4 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar54._8_4_ = (float)((uint)bVar4 * auVar41._8_4_ | (uint)!bVar4 * auVar42._8_4_);
  bVar4 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar54._12_4_ = (float)((uint)bVar4 * auVar41._12_4_ | (uint)!bVar4 * auVar42._12_4_);
  auVar85._0_4_ =
       (float)((uint)(bVar27 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar43._0_4_) *
       fVar98;
  auVar85._4_4_ = (float)((uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * auVar43._4_4_) * fVar91;
  auVar85._8_4_ = (float)((uint)bVar6 * auVar38._8_4_ | (uint)!bVar6 * auVar43._8_4_) * fVar96;
  auVar85._12_4_ = (float)((uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar43._12_4_) * fVar97;
  auVar90 = ZEXT1664(auVar85);
  auVar92._0_4_ =
       (float)((uint)(bVar27 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar48._0_4_) *
       auVar54._0_4_;
  auVar92._4_4_ =
       (float)((uint)bVar33 * auVar50._4_4_ | (uint)!bVar33 * auVar48._4_4_) * auVar54._4_4_;
  auVar92._8_4_ =
       (float)((uint)bVar5 * auVar50._8_4_ | (uint)!bVar5 * auVar48._8_4_) * auVar54._8_4_;
  auVar92._12_4_ =
       (float)((uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar48._12_4_) * auVar54._12_4_;
  auVar95 = ZEXT1664(auVar92);
  uVar36 = (ulong)(fVar98 < 0.0) * 0x20;
  local_2378[0] = *(undefined8 *)&pAVar2[1].bounds.bounds0.lower.field_0;
  auVar117 = ZEXT3264(CONCAT428(fVar98,CONCAT424(fVar98,CONCAT420(fVar98,CONCAT416(fVar98,CONCAT412(
                                                  fVar98,CONCAT48(fVar98,CONCAT44(fVar98,fVar98)))))
                                                )));
  auVar71._4_4_ = auVar85._0_4_;
  auVar71._0_4_ = auVar85._0_4_;
  auVar71._8_4_ = auVar85._0_4_;
  auVar71._12_4_ = auVar85._0_4_;
  auVar71._16_4_ = auVar85._0_4_;
  auVar71._20_4_ = auVar85._0_4_;
  auVar71._24_4_ = auVar85._0_4_;
  auVar71._28_4_ = auVar85._0_4_;
  auVar108._8_4_ = 0x80000000;
  auVar108._0_8_ = 0x8000000080000000;
  auVar108._12_4_ = 0x80000000;
  auVar108._16_4_ = 0x80000000;
  auVar108._20_4_ = 0x80000000;
  auVar108._24_4_ = 0x80000000;
  auVar108._28_4_ = 0x80000000;
  auVar109 = ZEXT3264(auVar108);
  auVar69 = vxorps_avx512vl(auVar71,auVar108);
  auVar118 = ZEXT3264(auVar69);
  auVar69 = vbroadcastsd_avx512vl(auVar55);
  auVar119 = ZEXT3264(auVar69);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  auVar107 = ZEXT3264(auVar106);
  auVar69 = vpermps_avx2(auVar106,ZEXT1632(auVar85));
  auVar69 = vxorps_avx512vl(auVar69,auVar108);
  auVar120 = ZEXT3264(auVar69);
  auVar70._8_4_ = 2;
  auVar70._0_8_ = 0x200000002;
  auVar70._12_4_ = 2;
  auVar70._16_4_ = 2;
  auVar70._20_4_ = 2;
  auVar70._24_4_ = 2;
  auVar70._28_4_ = 2;
  auVar84 = ZEXT3264(auVar70);
  auVar69 = vpermps_avx512vl(auVar70,ZEXT1632(auVar47));
  auVar121 = ZEXT3264(auVar69);
  auVar69 = vpermps_avx2(auVar70,ZEXT1632(auVar85));
  auVar69 = vxorps_avx512vl(auVar69,auVar108);
  auVar123 = ZEXT3264(auVar69);
  auVar69 = vbroadcastss_avx512vl(auVar54);
  auVar125 = ZEXT3264(auVar69);
  auVar69._4_4_ = auVar92._0_4_;
  auVar69._0_4_ = auVar92._0_4_;
  auVar69._8_4_ = auVar92._0_4_;
  auVar69._12_4_ = auVar92._0_4_;
  auVar69._16_4_ = auVar92._0_4_;
  auVar69._20_4_ = auVar92._0_4_;
  auVar69._24_4_ = auVar92._0_4_;
  auVar69._28_4_ = auVar92._0_4_;
  auVar69 = vxorps_avx512vl(auVar69,auVar108);
  auVar127 = ZEXT3264(auVar69);
  auVar69 = vpermps_avx512vl(auVar106,ZEXT1632(auVar54));
  auVar129 = ZEXT3264(auVar69);
  auVar69 = vpermps_avx2(auVar106,ZEXT1632(auVar92));
  auVar79 = ZEXT3264(auVar69);
  auVar69 = vxorps_avx512vl(auVar69,auVar108);
  auVar131 = ZEXT3264(auVar69);
  auVar69 = vpermps_avx512vl(auVar70,ZEXT1632(auVar54));
  auVar133 = ZEXT3264(auVar69);
  auVar69 = vpermps_avx2(auVar70,ZEXT1632(auVar92));
  auVar69 = vxorps_avx512vl(auVar69,auVar108);
  auVar135 = ZEXT3264(auVar69);
  uVar110 = auVar52._0_4_;
  auVar112 = ZEXT3264(CONCAT428(uVar110,CONCAT424(uVar110,CONCAT420(uVar110,CONCAT416(uVar110,
                                                  CONCAT412(uVar110,CONCAT48(uVar110,CONCAT44(
                                                  uVar110,uVar110))))))));
  auVar69 = vbroadcastss_avx512vl(auVar49);
  auVar137 = ZEXT3264(auVar69);
  pRVar22 = local_2368;
LAB_0084aa93:
  pRVar21 = (RayK<4> *)local_2378;
  if (pRVar22 != pRVar21) {
    pRVar30 = pRVar22 + -0x10;
    uVar19 = ~(ulong)(byte)local_267c & *(ulong *)(pRVar22 + -8);
    if (uVar19 != 0) {
      uVar26 = *(ulong *)pRVar30;
      do {
        auVar69 = auVar117._0_32_;
        auVar70 = auVar118._0_32_;
        auVar71 = auVar119._0_32_;
        auVar106 = auVar120._0_32_;
        auVar108 = auVar121._0_32_;
        auVar122 = auVar123._0_32_;
        local_2398 = auVar112._0_32_;
        auVar124 = auVar125._0_32_;
        auVar126 = auVar127._0_32_;
        auVar128 = auVar129._0_32_;
        auVar130 = auVar131._0_32_;
        auVar132 = auVar133._0_32_;
        auVar134 = auVar135._0_32_;
        auVar136 = auVar137._0_32_;
        if ((uVar26 & 8) != 0) {
          if (uVar19 != 0) {
            uVar19 = (ulong)((uint)uVar26 & 0xf);
            bVar27 = (byte)local_267c;
            if (uVar19 == 8) goto LAB_0084b3cb;
            bVar27 = (byte)local_267c ^ 0xf;
            auVar48 = *(undefined1 (*) [16])(ray + 0x50);
            auVar41 = *(undefined1 (*) [16])(ray + 0x50);
            pRVar21 = ray + 0x60;
            auVar43 = *(undefined1 (*) [16])pRVar21;
            auVar49 = *(undefined1 (*) [16])(ray + 0x40);
            auVar38 = *(undefined1 (*) [16])(ray + 0x40);
            auVar42 = *(undefined1 (*) [16])(ray + 0x90);
            lVar23 = (uVar26 & 0xfffffffffffffff0) + 0xc0;
            uVar26 = 0;
            goto LAB_0084ad92;
          }
          break;
        }
        auVar69 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar36),auVar70,auVar69);
        auVar70 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar32),auVar106,auVar71);
        auVar69 = vpmaxsd_avx2(auVar69,auVar70);
        auVar70 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar18),auVar122,auVar108);
        auVar70 = vpmaxsd_avx2(auVar70,local_2398);
        auVar69 = vpmaxsd_avx2(auVar69,auVar70);
        auVar70 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar36 ^ 0x20)),auVar126,
                             auVar124);
        auVar71 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar32 ^ 0x20)),auVar130,
                             auVar128);
        auVar70 = vpminsd_avx2(auVar70,auVar71);
        auVar71 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar18 ^ 0x20)),auVar134,
                             auVar132);
        auVar90 = ZEXT3264(auVar71);
        auVar71 = vpminsd_avx512vl(auVar71,auVar136);
        auVar84 = ZEXT3264(auVar71);
        auVar70 = vpminsd_avx2(auVar70,auVar71);
        auVar79 = ZEXT3264(auVar70);
        uVar25 = vcmpps_avx512vl(auVar69,auVar70,2);
        if ((char)uVar25 == '\0') {
          bVar33 = false;
        }
        else {
          uVar20 = 0;
          uVar28 = 8;
          do {
            lVar23 = 0;
            for (uVar19 = uVar25; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar23 = lVar23 + 1;
            }
            uVar110 = *(undefined4 *)(uVar26 + 0x40 + lVar23 * 4);
            auVar73._4_4_ = uVar110;
            auVar73._0_4_ = uVar110;
            auVar73._8_4_ = uVar110;
            auVar73._12_4_ = uVar110;
            auVar43 = vfmadd132ps_fma(auVar73,auVar113,auVar37);
            uVar110 = *(undefined4 *)(uVar26 + 0x80 + lVar23 * 4);
            auVar76._4_4_ = uVar110;
            auVar76._0_4_ = uVar110;
            auVar76._8_4_ = uVar110;
            auVar76._12_4_ = uVar110;
            auVar38 = vfmadd132ps_fma(auVar76,auVar114,auVar39);
            uVar110 = *(undefined4 *)(uVar26 + 0xc0 + lVar23 * 4);
            auVar80._4_4_ = uVar110;
            auVar80._0_4_ = uVar110;
            auVar80._8_4_ = uVar110;
            auVar80._12_4_ = uVar110;
            auVar48 = vfmadd132ps_fma(auVar80,auVar115,auVar40);
            auVar84 = ZEXT1664(auVar48);
            uVar110 = *(undefined4 *)(uVar26 + 0x60 + lVar23 * 4);
            auVar86._4_4_ = uVar110;
            auVar86._0_4_ = uVar110;
            auVar86._8_4_ = uVar110;
            auVar86._12_4_ = uVar110;
            auVar49 = vfmadd132ps_fma(auVar86,auVar113,auVar37);
            auVar90 = ZEXT1664(auVar49);
            uVar110 = *(undefined4 *)(uVar26 + 0xa0 + lVar23 * 4);
            auVar93._4_4_ = uVar110;
            auVar93._0_4_ = uVar110;
            auVar93._8_4_ = uVar110;
            auVar93._12_4_ = uVar110;
            auVar52 = vfmadd132ps_fma(auVar93,auVar114,auVar39);
            auVar95 = ZEXT1664(auVar52);
            uVar110 = *(undefined4 *)(uVar26 + 0xe0 + lVar23 * 4);
            auVar99._4_4_ = uVar110;
            auVar99._0_4_ = uVar110;
            auVar99._8_4_ = uVar110;
            auVar99._12_4_ = uVar110;
            auVar55 = vfmadd132ps_fma(auVar99,auVar115,auVar40);
            auVar103 = ZEXT1664(auVar55);
            auVar42 = vpminsd_avx(auVar43,auVar49);
            auVar41 = vpminsd_avx(auVar38,auVar52);
            auVar42 = vpmaxsd_avx(auVar42,auVar41);
            auVar41 = vpminsd_avx(auVar48,auVar55);
            auVar41 = vpmaxsd_avx512vl(auVar41,auVar46);
            auVar109 = ZEXT1664(auVar41);
            auVar42 = vpmaxsd_avx(auVar42,auVar41);
            auVar107 = ZEXT1664(auVar42);
            auVar41 = vpmaxsd_avx(auVar43,auVar49);
            auVar43 = vpmaxsd_avx(auVar38,auVar52);
            auVar43 = vpminsd_avx(auVar41,auVar43);
            auVar41 = vpmaxsd_avx(auVar48,auVar55);
            auVar41 = vpminsd_avx512vl(auVar41,in_ZMM21._0_16_);
            auVar79 = ZEXT1664(auVar41);
            auVar41 = vpminsd_avx(auVar43,auVar41);
            uVar34 = vpcmpd_avx512vl(auVar42,auVar41,2);
            uVar34 = uVar34 & 0xf;
            uVar19 = uVar20;
            uVar29 = uVar28;
            if (((char)uVar34 != '\0') &&
               (uVar29 = *(ulong *)(uVar26 + lVar23 * 8), uVar19 = uVar34, uVar28 != 8)) {
              *(ulong *)pRVar30 = uVar28;
              *(ulong *)(pRVar30 + 8) = uVar20;
              pRVar30 = pRVar30 + 0x10;
            }
            uVar25 = uVar25 - 1 & uVar25;
            uVar20 = uVar19;
            uVar28 = uVar29;
          } while (uVar25 != 0);
          bVar33 = uVar29 != 8;
          uVar26 = uVar29;
        }
      } while (bVar33);
    }
    goto LAB_0084b3f9;
  }
  goto LAB_0084b40c;
  while( true ) {
    uVar26 = uVar26 + 1;
    lVar23 = lVar23 + 0xe0;
    if (uVar19 - 8 <= uVar26) break;
LAB_0084ad92:
    uVar25 = 0;
    bVar24 = bVar27;
    while (uVar20 = (ulong)*(uint *)(lVar23 + uVar25 * 4), uVar20 != 0xffffffff) {
      uVar110 = *(undefined4 *)(lVar23 + -0xc0 + uVar25 * 4);
      auVar87._4_4_ = uVar110;
      auVar87._0_4_ = uVar110;
      auVar87._8_4_ = uVar110;
      auVar87._12_4_ = uVar110;
      fVar91 = *(float *)(lVar23 + -0xb0 + uVar25 * 4);
      auVar104._4_4_ = fVar91;
      auVar104._0_4_ = fVar91;
      auVar104._8_4_ = fVar91;
      auVar104._12_4_ = fVar91;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar23 + -0xa0 + uVar25 * 4)));
      uVar110 = *(undefined4 *)(lVar23 + -0x90 + uVar25 * 4);
      auVar111._4_4_ = uVar110;
      auVar111._0_4_ = uVar110;
      auVar111._8_4_ = uVar110;
      auVar111._12_4_ = uVar110;
      fVar96 = *(float *)(lVar23 + -0x80 + uVar25 * 4);
      auVar116._4_4_ = fVar96;
      auVar116._0_4_ = fVar96;
      auVar116._8_4_ = fVar96;
      auVar116._12_4_ = fVar96;
      uVar110 = *(undefined4 *)(lVar23 + -0x70 + uVar25 * 4);
      local_23a8._4_4_ = uVar110;
      local_23a8._0_4_ = uVar110;
      local_23a8._8_4_ = uVar110;
      local_23a8._12_4_ = uVar110;
      uVar110 = *(undefined4 *)(lVar23 + -0x30 + uVar25 * 4);
      auVar68._4_4_ = uVar110;
      auVar68._0_4_ = uVar110;
      auVar68._8_4_ = uVar110;
      auVar68._12_4_ = uVar110;
      uVar110 = *(undefined4 *)(lVar23 + -0x20 + uVar25 * 4);
      auVar74._4_4_ = uVar110;
      auVar74._0_4_ = uVar110;
      auVar74._8_4_ = uVar110;
      auVar74._12_4_ = uVar110;
      uVar110 = *(undefined4 *)(lVar23 + -0x10 + uVar25 * 4);
      auVar77._4_4_ = uVar110;
      auVar77._0_4_ = uVar110;
      auVar77._8_4_ = uVar110;
      auVar77._12_4_ = uVar110;
      auVar79 = ZEXT1664(auVar77);
      auVar55 = vsubss_avx512f(auVar87,auVar111);
      auVar50 = vbroadcastss_avx512vl(auVar55);
      auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar91 - fVar96)));
      auVar53 = vsubss_avx512f(auVar52,local_23a8);
      auVar56 = vbroadcastss_avx512vl(auVar53);
      auVar57 = vsubss_avx512f(auVar68,auVar87);
      auVar58 = vbroadcastss_avx512vl(auVar57);
      auVar59 = vsubss_avx512f(auVar74,auVar104);
      auVar60 = vbroadcastss_avx512vl(auVar59);
      auVar61 = vsubss_avx512f(auVar77,auVar52);
      auVar62 = vbroadcastss_avx512vl(auVar61);
      auVar61 = vmulss_avx512f(ZEXT416((uint)(fVar91 - fVar96)),auVar61);
      auVar81._0_4_ = auVar61._0_4_;
      auVar81._4_4_ = auVar81._0_4_;
      auVar81._8_4_ = auVar81._0_4_;
      auVar81._12_4_ = auVar81._0_4_;
      auVar61 = vfmsub231ps_avx512vl(auVar81,auVar60,auVar56);
      auVar84 = ZEXT1664(auVar61);
      auVar53 = vmulss_avx512f(auVar53,auVar57);
      auVar53 = vbroadcastss_avx512vl(auVar53);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar62,auVar50);
      auVar55 = vmulss_avx512f(auVar55,auVar59);
      auVar55 = vbroadcastss_avx512vl(auVar55);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar58,auVar51);
      auVar57 = vsubps_avx512vl(auVar87,*(undefined1 (*) [16])ray);
      auVar59 = vsubps_avx512vl(auVar104,*(undefined1 (*) [16])(ray + 0x10));
      auVar52 = vsubps_avx512vl(auVar52,*(undefined1 (*) [16])(ray + 0x20));
      auVar63 = vmulps_avx512vl(auVar41,auVar52);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar59,auVar43);
      auVar64 = vmulps_avx512vl(auVar43,auVar57);
      auVar64 = vfmsub231ps_avx512vl(auVar64,auVar52,auVar38);
      auVar107 = ZEXT1664(auVar64);
      auVar65 = vmulps_avx512vl(auVar38,auVar59);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar57,auVar41);
      auVar66 = vmulps_avx512vl(auVar55,auVar43);
      auVar66 = vfmadd231ps_avx512vl(auVar66,auVar53,auVar41);
      auVar66 = vfmadd231ps_avx512vl(auVar66,auVar61,auVar38);
      auVar11._8_4_ = 0x80000000;
      auVar11._0_8_ = 0x8000000080000000;
      auVar11._12_4_ = 0x80000000;
      auVar67 = vandps_avx512vl(auVar66,auVar11);
      auVar90 = ZEXT1664(auVar67);
      auVar62 = vmulps_avx512vl(auVar62,auVar65);
      auVar60 = vfmadd231ps_avx512vl(auVar62,auVar64,auVar60);
      auVar58 = vfmadd231ps_avx512vl(auVar60,auVar63,auVar58);
      auVar58 = vxorps_avx512vl(auVar67,auVar58);
      auVar103 = ZEXT864(0) << 0x20;
      uVar9 = vcmpps_avx512vl(auVar58,ZEXT816(0) << 0x20,5);
      bVar31 = (byte)uVar9 & bVar24;
      local_24f8 = (float)*(undefined8 *)(ray + 0x30);
      fStack_24f4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_24f0 = (float)*(undefined8 *)(ray + 0x38);
      fStack_24ec = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_2508 = (float)*(undefined8 *)(ray + 0x80);
      fStack_2504 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_2500 = (float)*(undefined8 *)(ray + 0x88);
      fStack_24fc = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if (bVar31 != 0) {
        auVar56 = vmulps_avx512vl(auVar56,auVar65);
        auVar51 = vfmadd213ps_avx512vl(auVar51,auVar64,auVar56);
        auVar50 = vfmadd213ps_avx512vl(auVar50,auVar63,auVar51);
        auVar50 = vxorps_avx512vl(auVar67,auVar50);
        auVar103 = ZEXT864(0) << 0x20;
        uVar9 = vcmpps_avx512vl(auVar50,ZEXT816(0) << 0x20,5);
        bVar31 = bVar31 & (byte)uVar9;
        if (bVar31 != 0) {
          auVar15._8_4_ = 0x7fffffff;
          auVar15._0_8_ = 0x7fffffff7fffffff;
          auVar15._12_4_ = 0x7fffffff;
          auVar51 = vandps_avx512vl(auVar66,auVar15);
          auVar107 = ZEXT1664(auVar51);
          auVar56 = vsubps_avx512vl(auVar51,auVar58);
          auVar103 = ZEXT1664(auVar56);
          uVar9 = vcmpps_avx512vl(auVar56,auVar50,5);
          bVar31 = bVar31 & (byte)uVar9;
          if (bVar31 != 0) {
            auVar52 = vmulps_avx512vl(auVar55,auVar52);
            auVar52 = vfmadd213ps_avx512vl(auVar59,auVar53,auVar52);
            auVar52 = vfmadd213ps_avx512vl(auVar57,auVar61,auVar52);
            auVar52 = vxorps_avx512vl(auVar67,auVar52);
            auVar84 = ZEXT1664(auVar52);
            auVar89._0_4_ = auVar51._0_4_ * local_24f8;
            auVar89._4_4_ = auVar51._4_4_ * fStack_24f4;
            auVar89._8_4_ = auVar51._8_4_ * fStack_24f0;
            auVar89._12_4_ = auVar51._12_4_ * fStack_24ec;
            auVar90 = ZEXT1664(auVar89);
            auVar101._0_4_ = auVar51._0_4_ * local_2508;
            auVar101._4_4_ = auVar51._4_4_ * fStack_2504;
            auVar101._8_4_ = auVar51._8_4_ * fStack_2500;
            auVar101._12_4_ = auVar51._12_4_ * fStack_24fc;
            auVar103 = ZEXT1664(auVar101);
            uVar9 = vcmpps_avx512vl(auVar52,auVar101,2);
            uVar10 = vcmpps_avx512vl(auVar89,auVar52,1);
            bVar31 = bVar31 & (byte)uVar9 & (byte)uVar10;
            if (bVar31 != 0) {
              auVar84 = ZEXT864(0) << 0x20;
              uVar9 = vcmpps_avx512vl(auVar66,ZEXT816(0) << 0x20,4);
              bVar31 = bVar31 & (byte)uVar9;
              if (bVar31 != 0) {
                auVar84 = ZEXT1664(auVar42);
                uVar1 = ((context->scene->geometries).items[uVar20].ptr)->mask;
                auVar16._4_4_ = uVar1;
                auVar16._0_4_ = uVar1;
                auVar16._8_4_ = uVar1;
                auVar16._12_4_ = uVar1;
                uVar9 = vptestmd_avx512vl(auVar42,auVar16);
                bVar31 = bVar31 & (byte)uVar9 & 0xf;
                if (bVar31 != 0) {
                  bVar24 = (bVar31 ^ 0xf) & bVar24;
                }
              }
            }
          }
        }
      }
      if (bVar24 == 0) {
        bVar33 = false;
        auVar52 = auVar38;
      }
      else {
        uVar110 = *(undefined4 *)(lVar23 + -0x60 + uVar25 * 4);
        auVar82._4_4_ = uVar110;
        auVar82._0_4_ = uVar110;
        auVar82._8_4_ = uVar110;
        auVar82._12_4_ = uVar110;
        uVar110 = *(undefined4 *)(lVar23 + -0x50 + uVar25 * 4);
        auVar88._4_4_ = uVar110;
        auVar88._0_4_ = uVar110;
        auVar88._8_4_ = uVar110;
        auVar88._12_4_ = uVar110;
        uVar110 = *(undefined4 *)(lVar23 + -0x40 + uVar25 * 4);
        auVar100._4_4_ = uVar110;
        auVar100._0_4_ = uVar110;
        auVar100._8_4_ = uVar110;
        auVar100._12_4_ = uVar110;
        auVar56 = vsubps_avx512vl(auVar82,auVar68);
        auVar57 = vsubps_avx512vl(auVar88,auVar74);
        auVar58 = vsubps_avx512vl(auVar100,auVar77);
        auVar59 = vsubps_avx512vl(auVar111,auVar82);
        auVar60 = vsubps_avx512vl(auVar116,auVar88);
        auVar61 = vsubps_avx512vl(local_23a8,auVar100);
        auVar52 = vmulps_avx512vl(auVar57,auVar61);
        auVar62 = vfmsub231ps_avx512vl(auVar52,auVar60,auVar58);
        auVar52 = vmulps_avx512vl(auVar58,auVar59);
        auVar63 = vfmsub231ps_avx512vl(auVar52,auVar61,auVar56);
        auVar79 = ZEXT1664(auVar63);
        auVar52 = vmulps_avx512vl(auVar56,auVar60);
        auVar68 = vfmsub231ps_avx512vl(auVar52,auVar59,auVar57);
        auVar55 = vsubps_avx(auVar82,*(undefined1 (*) [16])ray);
        auVar84 = ZEXT1664(auVar55);
        auVar50 = vsubps_avx(auVar88,*(undefined1 (*) [16])(ray + 0x10));
        auVar51 = vsubps_avx(auVar100,*(undefined1 (*) [16])(ray + 0x20));
        auVar52 = vmulps_avx512vl(auVar48,auVar51);
        auVar64 = vfmsub231ps_avx512vl(auVar52,auVar50,*(undefined1 (*) [16])pRVar21);
        fVar91 = (float)*(undefined8 *)pRVar21;
        auVar105._0_4_ = fVar91 * auVar55._0_4_;
        fVar96 = (float)((ulong)*(undefined8 *)pRVar21 >> 0x20);
        auVar105._4_4_ = fVar96 * auVar55._4_4_;
        fVar97 = (float)*(undefined8 *)(ray + 0x68);
        auVar105._8_4_ = fVar97 * auVar55._8_4_;
        fVar98 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
        auVar105._12_4_ = fVar98 * auVar55._12_4_;
        auVar53 = vfmsub231ps_fma(auVar105,auVar51,auVar49);
        auVar107 = ZEXT1664(auVar53);
        auVar52 = vmulps_avx512vl(auVar49,auVar50);
        auVar65 = vfmsub231ps_avx512vl(auVar52,auVar55,auVar48);
        auVar94._0_4_ = auVar68._0_4_ * fVar91;
        auVar94._4_4_ = auVar68._4_4_ * fVar96;
        auVar94._8_4_ = auVar68._8_4_ * fVar97;
        auVar94._12_4_ = auVar68._12_4_ * fVar98;
        auVar52 = vfmadd231ps_fma(auVar94,auVar63,auVar48);
        auVar52 = vfmadd231ps_fma(auVar52,auVar62,auVar49);
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar66 = vandps_avx512vl(auVar52,auVar12);
        auVar90 = ZEXT1664(auVar66);
        auVar61 = vmulps_avx512vl(auVar61,auVar65);
        auVar60 = vfmadd231ps_avx512vl(auVar61,auVar53,auVar60);
        auVar59 = vfmadd231ps_avx512vl(auVar60,auVar64,auVar59);
        auVar59 = vxorps_avx512vl(auVar66,auVar59);
        auVar60 = ZEXT816(0) << 0x20;
        uVar9 = vcmpps_avx512vl(auVar59,auVar60,5);
        bVar31 = (byte)uVar9 & bVar24;
        if (bVar31 == 0) {
LAB_0084b04f:
          auVar103 = ZEXT1664(auVar60);
        }
        else {
          auVar58 = vmulps_avx512vl(auVar58,auVar65);
          auVar53 = vfmadd213ps_avx512vl(auVar57,auVar53,auVar58);
          auVar53 = vfmadd213ps_avx512vl(auVar56,auVar64,auVar53);
          auVar53 = vxorps_avx512vl(auVar66,auVar53);
          auVar60 = ZEXT816(0) << 0x20;
          uVar9 = vcmpps_avx512vl(auVar53,auVar60,5);
          bVar31 = bVar31 & (byte)uVar9;
          if (bVar31 == 0) goto LAB_0084b04f;
          auVar13._8_4_ = 0x7fffffff;
          auVar13._0_8_ = 0x7fffffff7fffffff;
          auVar13._12_4_ = 0x7fffffff;
          auVar56 = vandps_avx512vl(auVar52,auVar13);
          auVar107 = ZEXT1664(auVar56);
          auVar57 = vsubps_avx512vl(auVar56,auVar59);
          auVar103 = ZEXT1664(auVar57);
          uVar9 = vcmpps_avx512vl(auVar57,auVar53,5);
          bVar31 = bVar31 & (byte)uVar9;
          if (bVar31 != 0) {
            auVar102._0_4_ = auVar68._0_4_ * auVar51._0_4_;
            auVar102._4_4_ = auVar68._4_4_ * auVar51._4_4_;
            auVar102._8_4_ = auVar68._8_4_ * auVar51._8_4_;
            auVar102._12_4_ = auVar68._12_4_ * auVar51._12_4_;
            auVar103 = ZEXT1664(auVar102);
            auVar50 = vfmadd213ps_fma(auVar50,auVar63,auVar102);
            auVar55 = vfmadd213ps_fma(auVar55,auVar62,auVar50);
            auVar75._0_4_ = auVar66._0_4_ ^ auVar55._0_4_;
            auVar75._4_4_ = auVar66._4_4_ ^ auVar55._4_4_;
            auVar75._8_4_ = auVar66._8_4_ ^ auVar55._8_4_;
            auVar75._12_4_ = auVar66._12_4_ ^ auVar55._12_4_;
            auVar78._0_4_ = auVar56._0_4_ * local_24f8;
            auVar78._4_4_ = auVar56._4_4_ * fStack_24f4;
            auVar78._8_4_ = auVar56._8_4_ * fStack_24f0;
            auVar78._12_4_ = auVar56._12_4_ * fStack_24ec;
            auVar79 = ZEXT1664(auVar78);
            auVar83._0_4_ = auVar56._0_4_ * local_2508;
            auVar83._4_4_ = auVar56._4_4_ * fStack_2504;
            auVar83._8_4_ = auVar56._8_4_ * fStack_2500;
            auVar83._12_4_ = auVar56._12_4_ * fStack_24fc;
            auVar84 = ZEXT1664(auVar83);
            uVar9 = vcmpps_avx512vl(auVar75,auVar83,2);
            uVar10 = vcmpps_avx512vl(auVar78,auVar75,1);
            bVar31 = bVar31 & (byte)uVar9 & (byte)uVar10;
            if (bVar31 != 0) {
              uVar9 = vcmpps_avx512vl(auVar52,ZEXT816(0) << 0x20,4);
              bVar31 = bVar31 & (byte)uVar9;
              if (bVar31 != 0) {
                uVar1 = ((context->scene->geometries).items[uVar20].ptr)->mask;
                auVar14._4_4_ = uVar1;
                auVar14._0_4_ = uVar1;
                auVar14._8_4_ = uVar1;
                auVar14._12_4_ = uVar1;
                uVar9 = vptestmd_avx512vl(auVar42,auVar14);
                bVar31 = bVar31 & (byte)uVar9 & 0xf;
                if (bVar31 != 0) {
                  bVar24 = (bVar31 ^ 0xf) & bVar24;
                }
              }
            }
          }
        }
        bVar33 = bVar24 != 0;
      }
      auVar137 = ZEXT3264(auVar136);
      auVar135 = ZEXT3264(auVar134);
      auVar133 = ZEXT3264(auVar132);
      auVar131 = ZEXT3264(auVar130);
      auVar129 = ZEXT3264(auVar128);
      auVar127 = ZEXT3264(auVar126);
      auVar125 = ZEXT3264(auVar124);
      auVar123 = ZEXT3264(auVar122);
      auVar121 = ZEXT3264(auVar108);
      auVar120 = ZEXT3264(auVar106);
      auVar119 = ZEXT3264(auVar71);
      auVar118 = ZEXT3264(auVar70);
      auVar117 = ZEXT3264(auVar69);
      auVar95 = ZEXT1664(auVar52);
      auVar109 = ZEXT1664(auVar68);
      auVar112 = ZEXT3264(local_2398);
      if ((!bVar33) || (bVar33 = 2 < uVar25, uVar25 = uVar25 + 1, bVar33)) break;
    }
    bVar27 = bVar27 & bVar24;
    if (bVar27 == 0) break;
  }
  bVar27 = bVar27 ^ 0xf;
LAB_0084b3cb:
  bVar27 = (byte)local_267c | bVar27;
  local_267c = (uint)bVar27;
  bVar24 = (byte)local_2678 & ~bVar27;
  local_2678 = (uint)bVar24;
  if (bVar24 == 0) {
    pRVar21 = (RayK<4> *)0x1;
    pRVar22 = pRVar30;
  }
  else {
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar33 = (bool)(bVar27 >> 1 & 1);
    bVar3 = (bool)(bVar27 >> 2 & 1);
    in_ZMM21 = ZEXT1664(CONCAT412((uint)(bVar27 >> 3) * auVar42._12_4_ |
                                  (uint)!(bool)(bVar27 >> 3) * in_ZMM21._12_4_,
                                  CONCAT48((uint)bVar3 * auVar42._8_4_ |
                                           (uint)!bVar3 * in_ZMM21._8_4_,
                                           CONCAT44((uint)bVar33 * auVar42._4_4_ |
                                                    (uint)!bVar33 * in_ZMM21._4_4_,
                                                    (uint)(bVar27 & 1) * auVar42._0_4_ |
                                                    (uint)!(bool)(bVar27 & 1) * in_ZMM21._0_4_))));
LAB_0084b3f9:
    pRVar21 = (RayK<4> *)0x0;
    pRVar22 = pRVar30;
  }
  if ((char)pRVar21 != '\0') goto LAB_0084b40c;
  goto LAB_0084aa93;
LAB_0084b40c:
  if (uVar35 == 0) {
    bVar17 = (byte)local_267c & bVar17;
    bVar33 = (bool)(bVar17 >> 1 & 1);
    bVar3 = (bool)(bVar17 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar17 & 1) * -0x800000 | (uint)!(bool)(bVar17 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar33 * -0x800000 | (uint)!bVar33 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar17 >> 3) * -0x800000 | (uint)!(bool)(bVar17 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_0084a746;
}

Assistant:

__forceinline vboolf4 operator !=(const vint4& a, const vint4& b) { return _mm_cmp_epi32_mask(a,b,_MM_CMPINT_NE); }